

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  GetterXsYs<unsigned_long_long> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  GetterXsYRef<unsigned_long_long> *pGVar13;
  ImDrawVert *pIVar14;
  uint *puVar15;
  ImVec2 IVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  ImPlotContext *pIVar20;
  ImPlotContext *pIVar21;
  uint uVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  pIVar20 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar9 = pGVar10->Count;
  lVar23 = (long)(((pGVar10->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar10->Stride;
  uVar3 = *(unsigned_long_long *)((long)pGVar10->Xs + lVar23);
  uVar4 = *(unsigned_long_long *)((long)pGVar10->Ys + lVar23);
  dVar17 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar5 = pIVar20->LogDenX;
  pIVar12 = pIVar20->CurrentPlot;
  dVar6 = (pIVar12->XAxis).Range.Min;
  dVar7 = (pIVar12->XAxis).Range.Max;
  dVar18 = log10((((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) /
                 pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  pIVar21 = GImPlot;
  iVar9 = pTVar11->YAxis;
  pIVar12 = pIVar20->CurrentPlot;
  dVar8 = pIVar12->YAxis[iVar9].Range.Min;
  fVar27 = (float)((((double)(float)(dVar17 / dVar5) * (dVar7 - dVar6) + dVar6) -
                   (pIVar12->XAxis).Range.Min) * pIVar20->Mx +
                  (double)pIVar20->PixelRange[iVar9].Min.x);
  fVar25 = (float)((((double)(float)(dVar18 / pIVar20->LogDenY[iVar9]) *
                     (pIVar12->YAxis[iVar9].Range.Max - dVar8) + dVar8) - dVar8) *
                   pIVar20->My[iVar9] + (double)pIVar20->PixelRange[iVar9].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  iVar9 = pGVar13->Count;
  uVar3 = *(unsigned_long_long *)
           ((long)pGVar13->Xs +
           (long)(((prim + 1 + pGVar13->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar13->Stride);
  dVar5 = pGVar13->YRef;
  dVar17 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar6 = pIVar21->LogDenX;
  pIVar12 = pIVar21->CurrentPlot;
  dVar7 = (pIVar12->XAxis).Range.Min;
  dVar8 = (pIVar12->XAxis).Range.Max;
  dVar18 = log10(dVar5 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar9 = pTVar11->YAxis;
  pIVar12 = pIVar21->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar9].Range.Min;
  fVar24 = (float)((((double)(float)(dVar17 / dVar6) * (dVar8 - dVar7) + dVar7) -
                   (pIVar12->XAxis).Range.Min) * pIVar21->Mx +
                  (double)pIVar21->PixelRange[iVar9].Min.x);
  fVar29 = (float)((((double)(float)(dVar18 / pIVar21->LogDenY[iVar9]) *
                     (pIVar12->YAxis[iVar9].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar21->My[iVar9] + (double)pIVar21->PixelRange[iVar9].Min.y);
  fVar26 = (this->P12).x;
  fVar28 = fVar26 - fVar24;
  fVar31 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar32 = fVar31 * fVar25 - fVar27 * fVar1;
  fVar26 = fVar26 * fVar29 - fVar24 * fVar2;
  fVar31 = fVar31 - fVar27;
  fVar30 = fVar31 * (fVar2 - fVar29) - fVar28 * (fVar1 - fVar25);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar14 = DrawList->_VtxWritePtr;
  pIVar14->col = this->Col;
  pIVar14[1].pos.x = fVar27;
  pIVar14[1].pos.y = fVar25;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar14 = DrawList->_VtxWritePtr;
  pIVar14[1].col = this->Col;
  IVar19.y = ((fVar2 - fVar29) * fVar32 - (fVar1 - fVar25) * fVar26) / fVar30;
  IVar19.x = (fVar32 * fVar28 - fVar31 * fVar26) / fVar30;
  pIVar14[2].pos = IVar19;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar14 = DrawList->_VtxWritePtr;
  pIVar14[2].col = this->Col;
  pIVar14[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar14 = DrawList->_VtxWritePtr;
  pIVar14[3].col = this->Col;
  IVar16.y = fVar29;
  IVar16.x = fVar24;
  pIVar14[4].pos = IVar16;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar14 = DrawList->_VtxWritePtr;
  pIVar14[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar14 + 5;
  puVar15 = DrawList->_IdxWritePtr;
  *puVar15 = DrawList->_VtxCurrentIdx;
  uVar22 = -(uint)(fVar2 < fVar1 && fVar25 < fVar29 || fVar1 < fVar2 && fVar29 < fVar25) & 1;
  puVar15[1] = DrawList->_VtxCurrentIdx + uVar22 + 1;
  puVar15[2] = DrawList->_VtxCurrentIdx + 3;
  puVar15[3] = DrawList->_VtxCurrentIdx + 1;
  puVar15[4] = (uVar22 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar15[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar15 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar27;
  (this->P11).y = fVar25;
  (this->P12).x = fVar24;
  (this->P12).y = fVar29;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }